

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MeasurementFactory.cpp
# Opt level: O1

Measurement * __thiscall
MeasurementFactory::CreateMeasurement
          (MeasurementFactory *this,istringstream *iss,SensorContainer *sensors)

{
  int iVar1;
  Sensor *sensor;
  Matrix<double,__1,_1,_0,__1,_1> *__ptr;
  DenseIndex DVar2;
  mapped_type *ppSVar3;
  long lVar4;
  Measurement *pMVar5;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pCVar6;
  istringstream *this_00;
  float rho_dot;
  float theta;
  float py;
  float px;
  float vy_gt;
  float vx_gt;
  VectorXd measurements;
  long timestamp;
  string sensor_type;
  float local_b0;
  float local_ac;
  double local_a8;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_a0;
  double local_80;
  float local_78;
  float local_74;
  double local_70;
  DenseStorage<double,__1,__1,_1,_0> local_68;
  long local_58;
  key_type local_50;
  
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::operator>>((istream *)iss,(string *)&local_50);
  ppSVar3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sensor_*>_>_>
            ::at(sensors,&local_50);
  sensor = *ppSVar3;
  iVar1 = sensor->df_;
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage(&local_68,(long)iVar1,(long)iVar1,1);
  if (iVar1 < 0) {
    __assert_fail("dim >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/Matrix.h"
                  ,0xf0,
                  "Eigen::Matrix<double, -1, 1>::Matrix(Index) [_Scalar = double, _Rows = -1, _Cols = 1, _Options = 0, _MaxRows = -1, _MaxCols = 1]"
                 );
  }
  if (sensor != (Sensor *)0x0) {
    lVar4 = __dynamic_cast(sensor,&Sensor::typeinfo,&LidarSensor::typeinfo,0);
    if (lVar4 == 0) {
      lVar4 = __dynamic_cast(sensor,&Sensor::typeinfo,&RadarSensor::typeinfo,0);
      if (lVar4 == 0) goto LAB_0011190e;
      std::istream::_M_extract<float>((float *)iss);
      std::istream::_M_extract<float>((float *)iss);
      std::istream::_M_extract<float>((float *)iss);
      local_a0.m_row = 0;
      local_a0.m_col = 1;
      local_a0.m_currentBlockRows = 1;
      *local_68.m_data = (double)local_a8._0_4_;
      local_70 = (double)local_ac;
      local_a0.m_xpr = (Matrix<double,__1,_1,_0,__1,_1> *)&local_68;
      pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                         (&local_a0,&local_70);
      local_80 = (double)local_b0;
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_(pCVar6,&local_80);
    }
    else {
      std::istream::_M_extract<float>((float *)iss);
      std::istream::_M_extract<float>((float *)iss);
      local_a0.m_row = 0;
      local_a0.m_col = 1;
      local_a0.m_currentBlockRows = 1;
      *local_68.m_data = (double)local_80._0_4_;
      local_70 = (double)local_a8._0_4_;
      local_a0.m_xpr = (Matrix<double,__1,_1,_0,__1,_1> *)&local_68;
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                (&local_a0,&local_70);
    }
    if ((local_a0.m_currentBlockRows + local_a0.m_row != *(DenseIndex *)((long)local_a0.m_xpr + 8))
       || (local_a0.m_col != 1)) goto LAB_00111a75;
  }
LAB_0011190e:
  this_00 = iss;
  std::istream::_M_extract<long>((long *)iss);
  pMVar5 = CreateMeasurement((MeasurementFactory *)this_00,sensor,local_58,(VectorXd *)&local_68);
  if (pMVar5 != (Measurement *)0x0) {
    std::istream::_M_extract<float>((float *)iss);
    std::istream::_M_extract<float>((float *)iss);
    std::istream::_M_extract<float>((float *)iss);
    std::istream::_M_extract<float>((float *)iss);
    Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
              ((DenseStorage<double,__1,__1,_1,_0> *)&local_a0,4,4,1);
    __ptr = (Matrix<double,__1,_1,_0,__1,_1> *)
            (pMVar5->ground_truth_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
            m_storage.m_data;
    (pMVar5->ground_truth_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
    .m_data = (double *)local_a0.m_xpr;
    DVar2 = (pMVar5->ground_truth_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
            m_storage.m_rows;
    (pMVar5->ground_truth_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
    .m_rows = local_a0.m_row;
    local_a0.m_xpr = __ptr;
    local_a0.m_row = DVar2;
    free(__ptr);
    local_a0.m_row = 0;
    local_a0.m_col = 1;
    local_a0.m_currentBlockRows = 1;
    *(pMVar5->ground_truth_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
     m_storage.m_data = (double)local_ac;
    local_70 = (double)local_b0;
    local_a0.m_xpr = &pMVar5->ground_truth_;
    pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                       (&local_a0,&local_70);
    local_80 = (double)local_74;
    pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                       (pCVar6,&local_80);
    local_a8 = (double)local_78;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_(pCVar6,&local_a8);
    if ((local_a0.m_currentBlockRows + local_a0.m_row != *(DenseIndex *)((long)local_a0.m_xpr + 8))
       || (local_a0.m_col != 1)) {
LAB_00111a75:
      __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/CommaInitializer.h"
                    ,0x6f,
                    "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, -1, 1>>::finished() [MatrixType = Eigen::Matrix<double, -1, 1>]"
                   );
    }
  }
  free(local_68.m_data);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return pMVar5;
}

Assistant:

Measurement *MeasurementFactory::CreateMeasurement(std::istringstream &iss, const SensorContainer &sensors) {

    string sensor_type;
    const Sensor *sensor = 0;
    SensorContainer::iterator si;
    long timestamp;

    iss >> sensor_type;

    try {
        sensor = sensors.at(sensor_type);
    } catch (const std::out_of_range &e) {
        // discard measurement because sensor not valid
   	//std::cout << "Invalid sensor type" << std::endl;
        return 0;
    }

    VectorXd measurements(sensor->df_);

    if (dynamic_cast<const LidarSensor*>(sensor) != 0) {
      float px;
      float py;
      
      iss >> px;
      iss >> py;

      measurements << px, py;

    } else if (dynamic_cast<const RadarSensor*>(sensor) != 0) {
      float rho;
      float theta;
      float rho_dot;

      iss >> rho;
      iss >> theta;
      iss >> rho_dot;

      measurements << rho, theta, rho_dot;
    }   

    iss >> timestamp;

    Measurement *m = CreateMeasurement(sensor, timestamp, measurements);

    // read ground truth data and store it with the measurement
    if (m) {

        float x_gt;
        float y_gt;
        float vx_gt;
        float vy_gt;
        iss >> x_gt;
        iss >> y_gt;
        iss >> vx_gt;
        iss >> vy_gt;
	m->ground_truth_ = VectorXd(4);
        m->ground_truth_  << x_gt, y_gt, vx_gt, vy_gt;
    }

    return m;
}